

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib670.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  CURL *pCVar3;
  curl_httppost *formpost;
  ReadThis pooh;
  curl_httppost *lastptr;
  
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    pooh.origin = 0;
    pooh.count = 0;
    pCVar3 = (CURL *)curl_easy_init();
    pooh.easy = pCVar3;
    iVar1 = curl_easy_setopt(pCVar3,0x2712,URL);
    if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(pCVar3,0x29,1), iVar1 == 0)) &&
       (iVar1 = curl_easy_setopt(pCVar3,0x2a,1), iVar1 == 0)) {
      iVar1 = 0;
      iVar2 = curl_formadd(&formpost,&lastptr,1,"field",0x13,&pooh,0x14,2,0x11);
      if (iVar2 == 0) {
        iVar1 = curl_easy_setopt(pooh.easy,0x4e2c,read_callback);
        if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(pooh.easy,0x2728,formpost), iVar1 == 0)) &&
           ((iVar1 = curl_easy_setopt(pooh.easy,0x2749), iVar1 == 0 &&
            ((iVar1 = curl_easy_setopt(pooh.easy,0x4efb,xferinfo), iVar1 == 0 &&
             (iVar1 = curl_easy_setopt(pooh.easy,0x2b,0), iVar1 == 0)))))) {
          iVar1 = curl_easy_perform(pooh.easy);
        }
      }
      else {
        curl_mfprintf(_stderr,"curl_formadd() = %d\n",iVar2);
      }
    }
    curl_easy_cleanup(pooh.easy);
    curl_formfree(formpost);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
#if defined(LIB670) || defined(LIB671)
  curl_mime *mime = NULL;
  curl_mimepart *part;
#else
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
#endif
#if defined(LIB670) || defined(LIB672)
  CURLM *multi = NULL;
  CURLMcode mres;
  CURLMsg *msg;
  int msgs_left;
  int still_running = 0;
#endif

  struct ReadThis pooh;
  CURLcode result;
  int res = TEST_ERR_FAILURE;

  /*
   * Check proper pausing/unpausing from a mime or form read callback.
   */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  pooh.origin = (time_t) 0;
  pooh.count = 0;
  pooh.easy = curl_easy_init();

  /* First set the URL that is about to receive our POST. */
  test_setopt(pooh.easy, CURLOPT_URL, URL);

  /* get verbose debug output please */
  test_setopt(pooh.easy, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(pooh.easy, CURLOPT_HEADER, 1L);

#if defined(LIB670) || defined(LIB671)
  /* Build the mime tree. */
  mime = curl_mime_init(pooh.easy);
  part = curl_mime_addpart(mime);
  result = curl_mime_name(part, name);
  if(!result)
    res = curl_mime_data_cb(part, (curl_off_t) 2, read_callback,
                            NULL, NULL, &pooh);

  if(result) {
    fprintf(stderr,
            "Something went wrong when building the mime structure: %d\n",
            (int) result);
    goto test_cleanup;
  }

  /* Bind mime data to its easy handle. */
  if(!res)
    test_setopt(pooh.easy, CURLOPT_MIMEPOST, mime);
#else
  /* Build the form. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, name,
                        CURLFORM_STREAM, &pooh,
                        CURLFORM_CONTENTLEN, (curl_off_t) 2,
                        CURLFORM_END);
  if(formrc) {
    fprintf(stderr, "curl_formadd() = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* We want to use our own read function. */
  test_setopt(pooh.easy, CURLOPT_READFUNCTION, read_callback);

  /* Send a multi-part formpost. */
  test_setopt(pooh.easy, CURLOPT_HTTPPOST, formpost);
#endif

#if defined(LIB670) || defined(LIB672)
  /* Use the multi interface. */
  multi = curl_multi_init();
  mres = curl_multi_add_handle(multi, pooh.easy);
  while(!mres) {
    struct timeval timeout;
    int rc = 0;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcept;
    int maxfd = -1;

    mres = curl_multi_perform(multi, &still_running);
    if(!still_running || mres != CURLM_OK)
      break;

    if(pooh.origin) {
      time_t delta = time(NULL) - pooh.origin;

      if(delta >= 4 * PAUSE_TIME) {
        fprintf(stderr, "unpausing failed: drain problem?\n");
        res = CURLE_OPERATION_TIMEDOUT;
        break;
      }

      if(delta >= PAUSE_TIME)
        curl_easy_pause(pooh.easy, CURLPAUSE_CONT);
    }

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcept);
    timeout.tv_sec = 0;
    timeout.tv_usec = 1000000 * PAUSE_TIME / 10;
    mres = curl_multi_fdset(multi, &fdread, &fdwrite, &fdexcept, &maxfd);
    if(mres)
      break;
#ifdef _WIN32
    if(maxfd == -1)
      Sleep(100);
    else
#endif
    rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcept, &timeout);
    if(rc == -1) {
      fprintf(stderr, "Select error\n");
      break;
    }
  }

  if(mres != CURLM_OK)
    for(;;) {
      msg = curl_multi_info_read(multi, &msgs_left);
      if(!msg)
        break;
      if(msg->msg == CURLMSG_DONE) {
        result = msg->data.result;
        res = (int) result;
      }
    }

  curl_multi_remove_handle(multi, pooh.easy);
  curl_multi_cleanup(multi);

#else
  /* Use the easy interface. */
  test_setopt(pooh.easy, CURLOPT_XFERINFODATA, &pooh);
  test_setopt(pooh.easy, CURLOPT_XFERINFOFUNCTION, xferinfo);
  test_setopt(pooh.easy, CURLOPT_NOPROGRESS, 0L);
  result = curl_easy_perform(pooh.easy);
  res = (int) result;
#endif


test_cleanup:
  curl_easy_cleanup(pooh.easy);
#if defined(LIB670) || defined(LIB671)
  curl_mime_free(mime);
#else
  curl_formfree(formpost);
#endif

  curl_global_cleanup();
  return res;
}